

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

TPZTransform<double> * __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>::BuildTransform2
          (TPZGeoElRefLess<pzgeom::TPZQuadraticTetra> *this,int side,TPZGeoEl *father,
          TPZTransform<double> *t)

{
  uint uVar1;
  TPZTransform<double> *pTVar2;
  TPZTransform<double> *in_RCX;
  uint in_EDX;
  TPZTransform<double> *in_RSI;
  TPZTransform<double> *in_RDI;
  int son;
  TPZGeoElSide fathloc;
  TPZGeoEl *myfather;
  TPZTransform<double> *trans;
  TPZTransform<double> *in_stack_fffffffffffffc28;
  TPZTransform<double> *in_stack_fffffffffffffc30;
  TPZTransform<double> *this_00;
  TPZTransform<double> *in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc6c;
  TPZTransform<double> *in_stack_fffffffffffffc70;
  TPZGeoElSide local_48;
  TPZTransform<double> *local_30;
  TPZTransform<double> *local_20;
  uint local_14;
  
  if (in_RSI == in_RCX) {
    TPZTransform<double>::TPZTransform(in_RSI,in_RDI);
    this_00 = in_RDI;
  }
  else {
    this_00 = in_RDI;
    local_20 = in_RCX;
    local_14 = in_EDX;
    local_30 = (TPZTransform<double> *)TPZGeoEl::Father((TPZGeoEl *)in_stack_fffffffffffffc30);
    if ((((int)local_14 < 0) || (0xe < (int)local_14)) || (local_30 == (TPZTransform<double> *)0x0))
    {
      std::operator<<((ostream *)&std::cerr,
                      "TPZGeoElRefLess::BuildTransform2 side out of range or father null\n");
      TPZTransform<double>::TPZTransform
                (in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68);
    }
    else {
      (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x49])(&local_48,in_RSI,(ulong)local_14);
      uVar1 = TPZGeoEl::WhichSubel((TPZGeoEl *)this_00);
      (*(local_30->super_TPZSavable)._vptr_TPZSavable[0x3d])
                (in_RDI,local_30,(ulong)local_14,(ulong)uVar1);
      TPZTransform<double>::Multiply(in_stack_fffffffffffffc58,in_RSI);
      TPZTransform<double>::operator=(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x181375d);
      pTVar2 = (TPZTransform<double> *)TPZGeoElSide::Element(&local_48);
      if (pTVar2 != local_20) {
        pTVar2 = local_30;
        uVar1 = TPZGeoElSide::Side(&local_48);
        (*(pTVar2->super_TPZSavable)._vptr_TPZSavable[0x4b])
                  (&stack0xfffffffffffffc58,pTVar2,(ulong)uVar1,local_20,in_RDI);
        TPZTransform<double>::operator=(pTVar2,in_stack_fffffffffffffc28);
        TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x1813840);
      }
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1813896);
    }
  }
  return this_00;
}

Assistant:

TPZTransform<>
TPZGeoElRefLess<TGeo>::BuildTransform2(int side, TPZGeoEl * father, TPZTransform<> &t)
{
	if(this == father) return t;
	TPZGeoEl *myfather = Father();
	if(side<0 || side>(TGeo::NSides-1) || !myfather){
		PZError << "TPZGeoElRefLess::BuildTransform2 side out of range or father null\n";
		return TPZTransform<>(0,0);
	}
	TPZGeoElSide fathloc = Father2(side);
	int son = WhichSubel();
	TPZTransform<> trans=myfather->GetTransform(side,son);
	trans = trans.Multiply(t);
	if(fathloc.Element() == father) return trans;
	trans = myfather->BuildTransform2(fathloc.Side(),father,trans);
	return trans;
}